

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O1

void __thiscall TlbImport::load(TlbImport *this,string *path,config_set *config,Registry *registry)

{
  ImportError *this_00;
  long *plVar1;
  long *plVar2;
  ifstream stream;
  long *local_298;
  long local_290;
  long local_288;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [4];
  int aiStack_218 [122];
  
  std::ifstream::ifstream(local_238,(path->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    (**(code **)((long)*this + 0x10))(this,local_238,config,registry);
    std::ifstream::~ifstream(local_238);
    return;
  }
  this_00 = (ImportError *)__cxa_allocate_exception(0x60);
  std::operator+(&local_258,"problem opening \'",path);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_298 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_298 == plVar2) {
    local_288 = *plVar2;
    uStack_280 = (undefined4)plVar1[3];
    uStack_27c = *(undefined4 *)((long)plVar1 + 0x1c);
    local_298 = &local_288;
  }
  else {
    local_288 = *plVar2;
  }
  local_290 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"");
  Typelib::ImportError::ImportError(this_00,(string *)&local_298,(string *)local_278,0,0);
  __cxa_throw(this_00,&Typelib::ImportError::typeinfo,Typelib::ImportError::~ImportError);
}

Assistant:

void TlbImport::load
    ( std::string const& path
    , utilmm::config_set const& config
    , Typelib::Registry& registry)
{
    // Loading from files seams to be broken on some distro's libxml2-packages,
    // so we load the whole file into memory before parsing
    std::ifstream stream(path.c_str());
    if (!stream.good())
        throw Parsing::ImportError("problem opening '"+path+"' for import");
    load(stream, config, registry);
}